

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

string * __thiscall
google::protobuf::Message::DebugString_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  undefined1 local_b8 [8];
  Printer printer;
  StringOutputStream output_stream;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TextFormat::Printer::Printer((Printer *)local_b8);
  printer.initial_indent_level_._1_1_ = 1;
  __return_storage_ptr__->_M_string_length = 0;
  *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
  io::StringOutputStream::StringOutputStream
            ((StringOutputStream *)&printer.finder_,__return_storage_ptr__);
  TextFormat::Printer::Print((Printer *)local_b8,this,(ZeroCopyOutputStream *)&printer.finder_);
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
               *)&printer.custom_printers_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_std::_Select1st<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_std::_Select1st<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
               *)&printer.default_field_value_printer_);
  if (printer.truncate_string_field_longer_than_ != 0) {
    (**(code **)(*(long *)printer.truncate_string_field_longer_than_ + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Message::DebugString() const {
  std::string debug_string;

  TextFormat::Printer printer;
  printer.SetExpandAny(true);

  printer.PrintToString(*this, &debug_string);

  return debug_string;
}